

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int lnsrchmod(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *jac,double *p,
             int N,double *dx,double maxstep,double eps2,double stol,double *x,double *jacf)

{
  bool bVar1;
  int iVar2;
  double *C;
  double *C_00;
  double *A;
  double *B;
  double *C_01;
  double *array;
  double *B_00;
  ulong uVar3;
  double *pdVar4;
  char *__format;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_108;
  double local_f8;
  double local_b8;
  int local_40;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_01 = (double *)malloc(0x10);
  array = (double *)malloc((long)N * 8);
  B_00 = (double *)malloc((long)N * 8);
  uVar5 = (ulong)(uint)N;
  local_108 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      local_108 = local_108 + dx[uVar3] * p[uVar3] * dx[uVar3] * p[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  if (local_108 < 0.0) {
    local_108 = sqrt(local_108);
  }
  else {
    local_108 = SQRT(local_108);
  }
  if (maxstep < local_108) {
    scale(p,1,N,maxstep / local_108);
    local_108 = maxstep;
  }
  mmult(jac,p,C,1,N,1);
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar7 = ABS(xi[uVar3]);
      if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
        dVar7 = 1.0 / ABS(dx[uVar3]);
      }
      array[uVar3] = p[uVar3] / dVar7;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  dVar6 = array_max_abs(array,N);
  dVar7 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar7)) {
LAB_0012582c:
    __format = "Program Exiting as the function value exceeds the maximum double value";
  }
  else {
    if (!NAN(dVar7)) {
      dVar6 = stol / dVar6;
      dVar8 = maxstep / local_108;
      local_b8 = 1.0;
      local_f8 = 1.0;
      dVar14 = 1.0;
      while( true ) {
        if (0 < N) {
          uVar3 = 0;
          do {
            B_00[uVar3] = p[uVar3] * dVar14;
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        madd(xi,B_00,x,1,N);
        dVar9 = (*funcpt->funcpt)(x,N,funcpt->params);
        if (1.79769313486232e+308 <= ABS(dVar9)) goto LAB_0012582c;
        if (NAN(dVar9)) goto LAB_001258a2;
        dVar10 = *C;
        if (dVar9 <= dVar14 * 0.0001 * dVar10 + dVar7) {
          iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
          if (iVar2 == 0xf) {
            return 0xf;
          }
          mmult(jacf,p,C_00,1,N,1);
          dVar10 = *C;
          dVar12 = dVar10 * 0.4;
          if (dVar12 < *C_00 || dVar12 == *C_00) {
            local_40 = 0;
            goto LAB_001254ff;
          }
          if (((maxstep <= local_108) || (dVar14 != 1.0)) || (NAN(dVar14))) goto LAB_0012553b;
          local_40 = 0;
          if (dVar10 * 0.0001 + dVar7 < dVar9) goto LAB_001254ff;
          dVar14 = 1.0;
          if ((dVar12 < *C_00 || dVar12 == *C_00) || (dVar8 <= 1.0)) goto LAB_0012553b;
          dVar14 = 1.0;
          goto LAB_0012533b;
        }
        if (dVar14 < dVar6) break;
        if ((dVar14 != 1.0) || (NAN(dVar14))) {
          *A = 1.0 / (dVar14 * dVar14);
          A[1] = -1.0 / (local_b8 * local_b8);
          A[2] = -local_b8 / (dVar14 * dVar14);
          A[3] = dVar14 / (local_b8 * local_b8);
          *B = (dVar9 - dVar7) - dVar14 * dVar10;
          B[1] = (local_f8 - dVar7) - local_b8 * dVar10;
          mmult(A,B,C_01,2,2,1);
          scale(C_01,1,2,1.0 / (dVar14 - local_b8));
          dVar10 = *C_01;
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            dVar12 = C_01[1];
            dVar10 = dVar12 * dVar12 + dVar10 * -3.0 * *C;
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            dVar10 = dVar10 - dVar12;
            dVar12 = 3.0;
            pdVar4 = C_01;
          }
          else {
            dVar10 = -*C;
            dVar12 = 2.0;
            pdVar4 = C_01 + 1;
          }
          dVar10 = dVar10 / (dVar12 * *pdVar4);
          if (dVar14 * 0.5 < dVar10) {
            dVar10 = dVar14 * 0.5;
          }
        }
        else {
          dVar12 = (dVar9 - dVar7) - dVar10;
          dVar10 = -dVar10 / (dVar12 + dVar12);
        }
        uVar3 = -(ulong)(dVar10 <= dVar14 * 0.1);
        local_b8 = dVar14;
        local_f8 = dVar9;
        dVar14 = (double)(~uVar3 & (ulong)dVar10 | (ulong)(dVar14 * 0.1) & uVar3);
      }
      local_40 = 1;
      if (0 < N) {
        uVar3 = 0;
        do {
          x[uVar3] = xi[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      goto LAB_001254ff;
    }
LAB_001258a2:
    __format = "Program Exiting as the function returns NaN";
  }
  printf(__format);
LAB_0012583a:
  free(C);
  local_40 = 0xf;
  goto LAB_0012584a;
  while( true ) {
    if (NAN(dVar9)) goto LAB_001258a2;
    dVar10 = *C;
    dVar13 = dVar14 * 0.0001 * dVar10 + dVar7;
    if (dVar9 <= dVar13) {
      iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
      if (iVar2 == 0xf) goto LAB_0012583a;
      mmult(jacf,p,C_00,1,N,1);
      dVar10 = *C;
      dVar13 = dVar14 * 0.0001 * dVar10 + dVar7;
    }
    if (((dVar13 < dVar9) || (dVar10 * 0.4 < *C_00 || dVar10 * 0.4 == *C_00)) || (dVar8 <= dVar12))
    break;
LAB_0012533b:
    local_b8 = dVar14;
    local_f8 = dVar9;
    dVar12 = local_b8 + local_b8;
    dVar14 = dVar12;
    if (dVar8 <= dVar12) {
      dVar14 = dVar8;
    }
    if (0 < N) {
      uVar3 = 0;
      do {
        B_00[uVar3] = p[uVar3] * dVar14;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    madd(xi,B_00,x,1,N);
    dVar9 = (*funcpt->funcpt)(x,N,funcpt->params);
    if (1.79769313486232e+308 <= ABS(dVar9)) goto LAB_0012582c;
  }
LAB_0012553b:
  local_40 = 0;
  if ((dVar14 < 1.0) || ((1.0 < dVar14 && (dVar14 * 0.0001 * dVar10 + dVar7 < dVar9)))) {
    dVar8 = dVar14;
    if (local_b8 <= dVar14) {
      dVar8 = local_b8;
    }
    dVar12 = *C_00;
    bVar1 = dVar12 < dVar10 * 0.4;
    if ((dVar12 < dVar10 * 0.4) && (dVar10 = ABS(local_b8 - dVar14), dVar6 <= dVar10)) {
      dVar13 = (double)(~-(ulong)(dVar14 < local_b8) & (ulong)dVar9 |
                       -(ulong)(dVar14 < local_b8) & (ulong)local_f8);
      if (local_b8 <= dVar14) {
        dVar9 = local_f8;
      }
      do {
        dVar14 = dVar13 - (dVar12 * dVar10 + dVar9);
        dVar12 = (-dVar12 * dVar10 * dVar10) / (dVar14 + dVar14);
        dVar14 = dVar10 * 0.2;
        if (dVar10 * 0.2 <= dVar12) {
          dVar14 = dVar12;
        }
        dVar16 = dVar8 + dVar14;
        if (0 < N) {
          uVar3 = 0;
          do {
            B_00[uVar3] = p[uVar3] * dVar16;
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        madd(xi,B_00,x,1,N);
        dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
        if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_0012582c;
        if (NAN(dVar11)) goto LAB_001258a2;
        if (dVar11 <= dVar16 * 0.0001 * *C + dVar7) {
          iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
          if (iVar2 == 0xf) goto LAB_0012583a;
          mmult(jacf,p,C_00,1,N,1);
          dVar12 = *C_00;
          dVar15 = *C * 0.4;
          if (dVar12 < dVar15) {
            dVar10 = dVar10 - dVar14;
            dVar9 = dVar11;
            dVar8 = dVar16;
          }
        }
        else {
          dVar12 = *C_00;
          dVar15 = *C * 0.4;
          dVar10 = dVar14;
          dVar13 = dVar11;
        }
        bVar1 = dVar12 < dVar15;
      } while ((dVar12 < dVar15) && (dVar6 <= dVar10));
    }
    if (bVar1) {
      if (0 < N) {
        uVar3 = 0;
        do {
          B_00[uVar3] = p[uVar3] * dVar8;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      madd(xi,B_00,x,1,N);
      local_40 = 5;
    }
  }
LAB_001254ff:
  free(C);
LAB_0012584a:
  free(A);
  free(B);
  free(C_01);
  free(array);
  free(B_00);
  free(C_00);
  return local_40;
}

Assistant:

int lnsrchmod(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *jac, double *p, int N, double * dx, double maxstep,
		double eps2,double stol,double *x,double *jacf) {
	int retval,i,gfdcode;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	double *slopen;
	double beta,lambdamax,lambdalo,lambdainc,lambdadiff,funclo,funchi;
	
	slopei = (double*) malloc(sizeof(double) *1);
	slopen = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	beta = 0.4;
	gfdcode = 0;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	//mdisplay(p,1,N);
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		free(slopen);
		return 15;
	}
	while (retval > 1) {
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		//printf("%g lmax %g %g \n",lambda,funcf,funci + alpha *lambda *slopei[0]);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			free(slopen);
			return 15;
		}
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
			if (gfdcode == 15) {
				return 15;
			}
			mmult(jacf,p,slopen,1,N,1);
			
			if(slopen[0] < beta * slopei[0]) {
					if (lambda == 1.0 && nlen < maxstep) {
						lambdamax = maxstep / nlen;
						
						while (funcf <= funci + alpha *lambda *slopei[0] && slopen[0] < beta * slopei[0] && lambda < lambdamax) {
							lambdaprev = lambda;
							funcprev = funcf;
							if ( 2*lambda < lambdamax) {
								lambda = 2*lambda;
							} else {
								lambda = lambdamax;
							}
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf <= funci + alpha *lambda *slopei[0]) {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
							}
						}
						
					}
					if (lambda < 1.0 || (lambda > 1.0 && funcf > funci + alpha *lambda *slopei[0])) {
						
						if (lambda < lambdaprev) {
							lambdalo = lambda; 
						} else {
							lambdalo = lambdaprev; 
						}
						lambdadiff = fabs(lambdaprev - lambda);
						
						if (lambda < lambdaprev) {
							funclo = funcf;
							funchi = funcprev;
						} else {
							funchi = funcf;
							funclo = funcprev;
						}

						while ((slopen[0] < beta * slopei[0]) && lambdadiff >= lambdamin) {
							lambdainc = -slopen[0] * lambdadiff * lambdadiff / (2.0 * (funchi - (funclo + slopen[0] *lambdadiff)));
							if ( lambdainc < 0.2 * lambdadiff) {
								lambdainc = 0.2 * lambdadiff;
							}
							lambda = lambdalo + lambdainc;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								free(slopei);
								free(temp1);
								free(temp2);
								free(ab);
								free(rcheck);
								free(pl);
								free(slopen);
								return 15;
							}
							if (funcf > funci + alpha *lambda *slopei[0]) {
								lambdadiff = lambdainc;
								funchi = funcf;
							} else {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									free(slopei);
									free(temp1);
									free(temp2);
									free(ab);
									free(rcheck);
									free(pl);
									free(slopen);
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
								if (slopen[0] < beta * slopei[0]) {
									lambdalo = lambda;
									lambdadiff -= lambdainc;
									funclo = funcf;
								}
							}
						}
						if (slopen[0] < beta * slopei[0]) {
							retval = -5;
							funcf = funclo;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambdalo;
							}
							madd(xi,pl,x,1,N);
						}
					}
						
			}
			
			if (retval != -5) {
				retval = 0;
			}
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	if (retval == -5) {
		retval = 5;
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	free(slopen);
	return retval;
}